

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int node;
  long lVar9;
  int il;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  TPZStack<int,_10> lowersides;
  
  if (side < 6) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                 ,0x1ec);
    }
    piVar6 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar6 = 1;
    piVar6 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar6 = 0;
    piVar6 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar6 = 0;
  }
  else if ((uint)side < 0xf) {
    uVar10 = order - 1;
    if (shapeorders->fRows != (long)(int)uVar10) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                 ,0x1f7);
    }
    uVar13 = 0;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = uVar13;
    }
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
      *piVar6 = (int)uVar13 + 2;
    }
  }
  else {
    if ((side == 0x13) || (side == 0xf)) {
      uVar11 = (long)((order + -1) * (order + -2)) / 2;
      iVar2 = (int)uVar11;
      uVar11 = uVar11 & 0xffffffff;
      if (shapeorders->fRows != (long)iVar2) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                   ,0x203);
      }
      TPZStack<int,_10>::TPZStack(&lowersides);
      pztopology::TPZPrism::LowerDimensionSides(side,&lowersides);
      TPZStack<int,_10>::Push(&lowersides,side);
      iVar1 = pztopology::TPZPrism::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar1);
      for (lVar9 = 0; lVar9 < locid.super_TPZVec<long>.fNElements; lVar9 = lVar9 + 1) {
        iVar1 = pztopology::TPZPrism::ContainedSideLocId(side,(int)lVar9);
        locid.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar1];
      }
      TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,(long)iVar2,3);
      TPZShapeTriang::SideShapeOrder(6,&locid.super_TPZVec<long>,order,&locshapeorders);
      uVar13 = 0;
      if (iVar2 < 1) {
        uVar11 = 0;
      }
      for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,0);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar6 = iVar2;
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,1);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
        *piVar6 = iVar2;
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,2);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
        *piVar6 = iVar2;
      }
    }
    else {
      if (0x12 < (uint)side) {
        iVar2 = order + -2;
        iVar1 = order + -1;
        if (shapeorders->fRows == (long)((iVar1 * iVar2 * iVar1) / 2)) {
          iVar12 = 0;
          if (iVar1 < 1) {
            iVar1 = 0;
          }
          iVar3 = 0;
          if (0 < iVar2) {
            iVar3 = iVar2;
          }
          for (iVar5 = 0; iVar5 != iVar3; iVar5 = iVar5 + 1) {
            for (iVar7 = 0; iVar7 != iVar2; iVar7 = iVar7 + 1) {
              iVar4 = iVar5 + iVar7 + 3;
              for (iVar8 = 2; iVar8 - iVar1 != 2; iVar8 = iVar8 + 1) {
                if (iVar7 + iVar5 < iVar2) {
                  lVar9 = (long)iVar12;
                  piVar6 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,0);
                  *piVar6 = iVar4;
                  piVar6 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,1);
                  *piVar6 = iVar4;
                  piVar6 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,2);
                  *piVar6 = iVar8;
                  iVar12 = iVar12 + 1;
                }
              }
            }
          }
          return;
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                   ,0x24d);
      }
      uVar11 = (ulong)(uint)((order + -1) * (order + -1));
      if (shapeorders->fRows != uVar11) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                   ,0x228);
      }
      TPZStack<int,_10>::TPZStack(&lowersides);
      pztopology::TPZPrism::LowerDimensionSides(side,&lowersides);
      TPZStack<int,_10>::Push(&lowersides,side);
      iVar2 = pztopology::TPZPrism::NSideNodes(side);
      TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar2);
      for (lVar9 = 0; lVar9 < locid.super_TPZVec<long>.fNElements; lVar9 = lVar9 + 1) {
        iVar2 = pztopology::TPZPrism::ContainedSideLocId(side,(int)lVar9);
        locid.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar2];
      }
      TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,uVar11,3);
      TPZShapeQuad::SideShapeOrder(8,&locid.super_TPZVec<long>,order,&locshapeorders);
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,0);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar6 = iVar2;
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,1);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
        *piVar6 = iVar2;
        piVar6 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar13,2);
        iVar2 = *piVar6;
        piVar6 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
        *piVar6 = iVar2;
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&locshapeorders);
    TPZManVector<long,_4>::~TPZManVector(&locid);
    TPZManVector<int,_10>::~TPZManVector(&lowersides.super_TPZManVector<int,_10>);
  }
  return;
}

Assistant:

void TPZShapePrism::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=5)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>5 && side<15)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side == 15||side == 19)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }


        }
        else if (side >= 16 && side <=18)
        {
            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo?
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }

        }
        else
        {   // interno
            int nshape = (order-2)*(order-1)*(order-1)/2;
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord1 = order - 2;
            int ord2 = order - 1;
            for (int i=0; i<ord1; i++) {
                for (int j=0; j<ord1; j++) {
                    for (int k=0; k<ord2; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int maxAB = a+b;//a>b? a : b;
                        if (   ( (a+b)<ord1 )  && (c < ord2)   ) // Duvida
                        {
                            shapeorders(count,0) = 3 + maxAB;
                            shapeorders(count,1) = 3 + maxAB;
                            shapeorders(count,2) = 2 + c;
                            count++;
                        }
                        
                    }
                    
                }
            }

//            int orderplus1 = order + 2;
//            int orderplus2 = order + 1;
//            for (int i=3; i<orderplus1; i++) {
//                for (int j=3; j<orderplus1; j++) {
//                    for (int k=3; k<orderplus2; k++) {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        if (   ( (a+b)<orderplus1 )  && (c < orderplus2)   ) // Duvida
//                        {
//                            shapeorders(count,0) = a;
//                            shapeorders(count,1) = b;
//                            shapeorders(count,2) = c;
//                            count++;
//                        }
//                        
//                    }
//                    
//                }
//            }

        }

    }